

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

AMQP_VALUE amqpvalue_get_composite_item(AMQP_VALUE value,size_t index)

{
  AMQP_VALUE pAVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (value == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar4 = "NULL value";
    iVar3 = 0x1cad;
  }
  else if ((value->type & ~AMQP_TYPE_NULL) == AMQP_TYPE_DESCRIBED) {
    pAVar1 = amqpvalue_get_list_item((value->value).described_value.value,index);
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return pAVar1;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar4 = "amqpvalue_get_list_item failed for composite item";
    iVar3 = 0x1cbe;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar4 = "Attempt to get composite item on a non-composite type";
    iVar3 = 0x1cb6;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
            ,"amqpvalue_get_composite_item",iVar3,1,pcVar4);
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_get_composite_item(AMQP_VALUE value, size_t index)
{
    AMQP_VALUE result;

    if (value == NULL)
    {
        LogError("NULL value");
        result = NULL;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)value;
        if ((value_data->type != AMQP_TYPE_COMPOSITE) &&
            (value_data->type != AMQP_TYPE_DESCRIBED))
        {
            LogError("Attempt to get composite item on a non-composite type");
            result = NULL;
        }
        else
        {
            result = amqpvalue_get_list_item(value_data->value.described_value.value, index);
            if (result == NULL)
            {
                LogError("amqpvalue_get_list_item failed for composite item");
            }
        }
    }

    return result;
}